

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

bool __thiscall leveldb::FindFileTest::Overlaps(FindFileTest *this,char *smallest,char *largest)

{
  bool bVar1;
  InternalKeyComparator cmp;
  Slice l;
  Slice s;
  InternalKeyComparator local_60;
  Slice local_50;
  Slice local_40;
  
  local_60.user_comparator_ = BytewiseComparator();
  local_50.data_ = largest;
  if (largest == (char *)0x0) {
    local_50.data_ = "";
  }
  local_60.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_00167958;
  if (largest != (char *)0x0) {
    largest = (char *)&local_50;
  }
  local_40.data_ = "";
  if (smallest != (char *)0x0) {
    local_40.data_ = smallest;
  }
  if (smallest != (char *)0x0) {
    smallest = (char *)&local_40;
  }
  local_40.size_ = strlen(local_40.data_);
  local_50.size_ = strlen(local_50.data_);
  bVar1 = SomeFileOverlapsRange
                    (&local_60,this->disjoint_sorted_files_,&this->files_,(Slice *)smallest,
                     (Slice *)largest);
  Comparator::~Comparator(&local_60.super_Comparator);
  return bVar1;
}

Assistant:

bool Overlaps(const char* smallest, const char* largest) {
    InternalKeyComparator cmp(BytewiseComparator());
    Slice s(smallest != nullptr ? smallest : "");
    Slice l(largest != nullptr ? largest : "");
    return SomeFileOverlapsRange(cmp, disjoint_sorted_files_, files_,
                                 (smallest != nullptr ? &s : nullptr),
                                 (largest != nullptr ? &l : nullptr));
  }